

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testValidateQuoteRequest(int count)

{
  undefined1 *puVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  long lVar4;
  long lVar5;
  int iVar6;
  timeval tv;
  NoRelatedSym noRelatedSym;
  DataDictionary dataDictionary;
  QuoteRequest message;
  timeval local_608;
  long local_5f8 [2];
  NoRelatedSym local_5e8;
  undefined1 local_570 [16];
  _Alloc_hider local_560;
  char local_550 [16];
  _Alloc_hider local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  size_t local_520;
  int local_518;
  QuoteRequest local_188;
  
  puVar1 = &local_5e8.super_Group.field_0x10;
  local_5e8.super_Group._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"1","");
  local_570._0_8_ = &PTR__FieldBase_0011c5d8;
  local_570._8_4_ = 0x83;
  local_560._M_p = local_550;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_560,local_5e8.super_Group._0_8_,
             (undefined1 *)(local_5e8.super_Group._0_8_ + local_5e8.super_Group._8_8_));
  local_540._M_p = (pointer)&local_530;
  local_538 = 0;
  local_530._M_local_buf[0] = '\0';
  local_520 = 0;
  local_518 = 0;
  local_570._0_8_ = &PTR__FieldBase_0011ca40;
  FIX42::QuoteRequest::QuoteRequest(&local_188,(QuoteReqID *)local_570);
  FIX::FieldBase::~FieldBase((FieldBase *)local_570);
  if ((undefined1 *)local_5e8.super_Group._0_8_ != puVar1) {
    operator_delete((void *)local_5e8.super_Group._0_8_,local_5e8.super_Group._16_8_ + 1);
  }
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym(&local_5e8);
  iVar6 = 10;
  do {
    local_608.tv_sec = (__time_t)local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"IBM","");
    local_570._0_8_ = &PTR__FieldBase_0011c5d8;
    local_570._8_4_ = 0x37;
    local_560._M_p = local_550;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,local_608.tv_sec,local_608.tv_usec + local_608.tv_sec);
    local_540._M_p = (pointer)&local_530;
    local_538 = 0;
    local_530._M_local_buf[0] = '\0';
    local_520 = 0;
    local_518 = 0;
    local_570._0_8_ = &PTR__FieldBase_0011c700;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    if ((long *)local_608.tv_sec != local_5f8) {
      operator_delete((void *)local_608.tv_sec,local_5f8[0] + 1);
    }
    FIX::StringField::StringField((StringField *)local_570,200);
    local_570._0_8_ = &PTR__FieldBase_0011c8b8;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    FIX::IntField::IntField((IntField *)local_570,0xc9,0);
    local_570._0_8_ = &PTR__FieldBase_0011c8f0;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    FIX::DoubleField::DoubleField((DoubleField *)local_570,0xca,120.0,0);
    local_570._0_8_ = &PTR__FieldBase_0011c960;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    FIX::CharField::CharField((CharField *)local_570,0x36,'1');
    local_570._0_8_ = &PTR__FieldBase_0011c738;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    FIX::DoubleField::DoubleField((DoubleField *)local_570,0x26,100.0,0);
    local_570._0_8_ = &PTR__FieldBase_0011c9d0;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    local_608.tv_sec = (__time_t)local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"USD","");
    local_570._0_8_ = &PTR__FieldBase_0011c5d8;
    local_570._8_4_ = 0xf;
    local_560._M_p = local_550;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,local_608.tv_sec,local_608.tv_usec + local_608.tv_sec);
    local_540._M_p = (pointer)&local_530;
    local_538 = 0;
    local_530._M_local_buf[0] = '\0';
    local_520 = 0;
    local_518 = 0;
    local_570._0_8_ = &PTR__FieldBase_0011ca08;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    if ((long *)local_608.tv_sec != local_5f8) {
      operator_delete((void *)local_608.tv_sec,local_5f8[0] + 1);
    }
    FIX::CharField::CharField((CharField *)local_570,0x28,'1');
    local_570._0_8_ = &PTR__FieldBase_0011c848;
    FIX::FieldMap::setField((FieldMap *)&local_5e8,(FieldBase *)local_570,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_570);
    FIX::FieldMap::addGroup
              ((int)&local_188,(FieldMap *)(ulong)(uint)local_5e8.super_Group.m_field,
               SUB81((FieldMap *)&local_5e8,0));
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  FIX::DataDictionary::DataDictionary((DataDictionary *)local_570);
  gettimeofday(&local_608,(__timezone_ptr_t)0x0);
  _Var3 = local_608.tv_usec;
  _Var2 = local_608.tv_sec;
  if (0 < count) {
    do {
      FIX::DataDictionary::validate
                ((Message *)&local_188,(DataDictionary *)local_570,(DataDictionary *)local_570);
      count = count + -1;
    } while (count != 0);
  }
  lVar5 = SUB168(SEXT816(_Var3) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday(&local_608,(__timezone_ptr_t)0x0);
  lVar4 = local_608.tv_sec - _Var2;
  FIX::DataDictionary::~DataDictionary((DataDictionary *)local_570);
  FIX::FieldMap::~FieldMap((FieldMap *)&local_5e8);
  FIX::Message::~Message((Message *)&local_188);
  return lVar4 * 1000 + local_608.tv_usec / 1000 + ((lVar5 >> 7) - (lVar5 >> 0x3f));
}

Assistant:

long testValidateQuoteRequest( int count )
{
  FIX42::QuoteRequest message( FIX::QuoteReqID("1") );
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for( int i = 1; i <= 10; ++i )
  {
    noRelatedSym.set( FIX::Symbol("IBM") );
    noRelatedSym.set( FIX::MaturityMonthYear() );
    noRelatedSym.set( FIX::PutOrCall(FIX::PutOrCall_PUT) );
    noRelatedSym.set( FIX::StrikePrice(120) );
    noRelatedSym.set( FIX::Side(FIX::Side_BUY) );
    noRelatedSym.set( FIX::OrderQty(100) );
    noRelatedSym.set( FIX::Currency("USD") );
    noRelatedSym.set( FIX::OrdType(FIX::OrdType_MARKET) );
    message.addGroup( noRelatedSym );
  }

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int j = 0; j <= count; ++j )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}